

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O3

void __thiscall
chrono::ChFile_ps_graph_setting::ChFile_ps_graph_setting
          (ChFile_ps_graph_setting *this,ChFile_ps_graph_setting *source)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  int iVar30;
  bool bVar31;
  undefined3 uVar32;
  bool bVar33;
  undefined7 uVar34;
  bool bVar35;
  undefined7 uVar36;
  size_t sVar37;
  
  ChFile_ps_axis_setting::ChFile_ps_axis_setting(&this->Xaxis);
  ChFile_ps_axis_setting::ChFile_ps_axis_setting(&this->Yaxis);
  (this->grid_color).b = 0.0;
  (this->grid_color).r = 0.0;
  (this->grid_color).g = 0.0;
  (this->title_color).r = 0.0;
  (this->title_color).g = 0.0;
  (this->title_color).b = 0.0;
  (this->def_line_color).r = 0.0;
  (this->def_line_color).g = 0.0;
  (this->def_line_color).b = 0.0;
  bVar33 = (source->Xaxis).axis;
  uVar34 = *(undefined7 *)&(source->Xaxis).field_0x1;
  dVar1 = (source->Xaxis).axis_color.r;
  dVar2 = (source->Xaxis).axis_color.g;
  dVar3 = (source->Xaxis).axis_color.b;
  dVar4 = (source->Xaxis).axis_width;
  bVar35 = (source->Xaxis).ticks;
  uVar36 = *(undefined7 *)&(source->Xaxis).field_0x29;
  dVar5 = (source->Xaxis).ticks_step;
  dVar6 = (source->Xaxis).ticks_width;
  uVar7 = *(undefined8 *)(source->Xaxis).label;
  uVar8 = *(undefined8 *)((source->Xaxis).label + 8);
  uVar9 = *(undefined8 *)((source->Xaxis).label + 0x10);
  uVar10 = *(undefined8 *)((source->Xaxis).label + 0x18);
  uVar11 = *(undefined8 *)((source->Xaxis).label + 0x20);
  uVar12 = *(undefined8 *)((source->Xaxis).label + 0x28);
  uVar13 = *(undefined8 *)((source->Xaxis).label + 0x30);
  uVar14 = *(undefined8 *)((source->Xaxis).label + 0x38);
  uVar15 = *(undefined8 *)((source->Xaxis).label + 0x40);
  uVar16 = *(undefined8 *)((source->Xaxis).label + 0x48);
  uVar17 = *(undefined8 *)((source->Xaxis).label + 0x50);
  uVar18 = *(undefined8 *)((source->Xaxis).label + 0x58);
  uVar19 = *(undefined8 *)((source->Xaxis).label + 0x60);
  dVar20 = (source->Xaxis).label_color.r;
  dVar21 = (source->Xaxis).label_color.g;
  dVar22 = (source->Xaxis).label_color.b;
  iVar30 = (source->Xaxis).label_fontname;
  bVar31 = (source->Xaxis).numbers;
  uVar32 = *(undefined3 *)&(source->Xaxis).field_0xcd;
  dVar23 = (source->Xaxis).numbers_color.r;
  dVar24 = (source->Xaxis).numbers_color.g;
  dVar25 = (source->Xaxis).numbers_color.b;
  dVar26 = (source->Xaxis).numbers_fontsize;
  dVar27 = (source->Xaxis).min;
  dVar28 = (source->Xaxis).max;
  (this->Xaxis).label_fontsize = (source->Xaxis).label_fontsize;
  (this->Xaxis).label_fontname = iVar30;
  (this->Xaxis).numbers = bVar31;
  *(undefined3 *)&(this->Xaxis).field_0xcd = uVar32;
  (this->Xaxis).numbers_color.r = dVar23;
  (this->Xaxis).numbers_color.g = dVar24;
  (this->Xaxis).numbers_color.b = dVar25;
  (this->Xaxis).numbers_fontsize = dVar26;
  (this->Xaxis).min = dVar27;
  (this->Xaxis).max = dVar28;
  *(undefined8 *)((this->Xaxis).label + 0x40) = uVar15;
  *(undefined8 *)((this->Xaxis).label + 0x48) = uVar16;
  *(undefined8 *)((this->Xaxis).label + 0x50) = uVar17;
  *(undefined8 *)((this->Xaxis).label + 0x58) = uVar18;
  *(undefined8 *)((this->Xaxis).label + 0x60) = uVar19;
  (this->Xaxis).label_color.r = dVar20;
  (this->Xaxis).label_color.g = dVar21;
  (this->Xaxis).label_color.b = dVar22;
  *(undefined8 *)(this->Xaxis).label = uVar7;
  *(undefined8 *)((this->Xaxis).label + 8) = uVar8;
  *(undefined8 *)((this->Xaxis).label + 0x10) = uVar9;
  *(undefined8 *)((this->Xaxis).label + 0x18) = uVar10;
  *(undefined8 *)((this->Xaxis).label + 0x20) = uVar11;
  *(undefined8 *)((this->Xaxis).label + 0x28) = uVar12;
  *(undefined8 *)((this->Xaxis).label + 0x30) = uVar13;
  *(undefined8 *)((this->Xaxis).label + 0x38) = uVar14;
  (this->Xaxis).axis = bVar33;
  *(undefined7 *)&(this->Xaxis).field_0x1 = uVar34;
  (this->Xaxis).axis_color.r = dVar1;
  (this->Xaxis).axis_color.g = dVar2;
  (this->Xaxis).axis_color.b = dVar3;
  (this->Xaxis).axis_width = dVar4;
  (this->Xaxis).ticks = bVar35;
  *(undefined7 *)&(this->Xaxis).field_0x29 = uVar36;
  (this->Xaxis).ticks_step = dVar5;
  (this->Xaxis).ticks_width = dVar6;
  uVar34 = *(undefined7 *)&(source->Yaxis).field_0x1;
  dVar1 = (source->Yaxis).axis_color.r;
  dVar2 = (source->Yaxis).axis_color.g;
  dVar3 = (source->Yaxis).axis_color.b;
  dVar4 = (source->Yaxis).axis_width;
  bVar31 = (source->Yaxis).ticks;
  uVar36 = *(undefined7 *)&(source->Yaxis).field_0x29;
  dVar5 = (source->Yaxis).ticks_step;
  dVar6 = (source->Yaxis).ticks_width;
  uVar7 = *(undefined8 *)(source->Yaxis).label;
  uVar8 = *(undefined8 *)((source->Yaxis).label + 8);
  uVar9 = *(undefined8 *)((source->Yaxis).label + 0x10);
  uVar10 = *(undefined8 *)((source->Yaxis).label + 0x18);
  uVar11 = *(undefined8 *)((source->Yaxis).label + 0x20);
  uVar12 = *(undefined8 *)((source->Yaxis).label + 0x28);
  uVar13 = *(undefined8 *)((source->Yaxis).label + 0x30);
  uVar14 = *(undefined8 *)((source->Yaxis).label + 0x38);
  uVar15 = *(undefined8 *)((source->Yaxis).label + 0x40);
  uVar16 = *(undefined8 *)((source->Yaxis).label + 0x48);
  uVar17 = *(undefined8 *)((source->Yaxis).label + 0x50);
  uVar18 = *(undefined8 *)((source->Yaxis).label + 0x58);
  uVar19 = *(undefined8 *)((source->Yaxis).label + 0x60);
  dVar20 = (source->Yaxis).label_color.r;
  dVar21 = (source->Yaxis).label_color.g;
  dVar22 = (source->Yaxis).label_color.b;
  dVar23 = (source->Yaxis).label_fontsize;
  iVar30 = (source->Yaxis).label_fontname;
  bVar33 = (source->Yaxis).numbers;
  uVar32 = *(undefined3 *)&(source->Yaxis).field_0xcd;
  dVar24 = (source->Yaxis).numbers_color.r;
  dVar25 = (source->Yaxis).numbers_color.g;
  dVar26 = (source->Yaxis).numbers_color.b;
  dVar27 = (source->Yaxis).numbers_fontsize;
  dVar28 = (source->Yaxis).min;
  dVar29 = (source->Yaxis).max;
  (this->Yaxis).axis = (source->Yaxis).axis;
  *(undefined7 *)&(this->Yaxis).field_0x1 = uVar34;
  (this->Yaxis).axis_color.r = dVar1;
  (this->Yaxis).axis_color.g = dVar2;
  (this->Yaxis).axis_color.b = dVar3;
  (this->Yaxis).axis_width = dVar4;
  (this->Yaxis).ticks = bVar31;
  *(undefined7 *)&(this->Yaxis).field_0x29 = uVar36;
  (this->Yaxis).ticks_step = dVar5;
  (this->Yaxis).ticks_width = dVar6;
  *(undefined8 *)(this->Yaxis).label = uVar7;
  *(undefined8 *)((this->Yaxis).label + 8) = uVar8;
  *(undefined8 *)((this->Yaxis).label + 0x10) = uVar9;
  *(undefined8 *)((this->Yaxis).label + 0x18) = uVar10;
  *(undefined8 *)((this->Yaxis).label + 0x20) = uVar11;
  *(undefined8 *)((this->Yaxis).label + 0x28) = uVar12;
  *(undefined8 *)((this->Yaxis).label + 0x30) = uVar13;
  *(undefined8 *)((this->Yaxis).label + 0x38) = uVar14;
  *(undefined8 *)((this->Yaxis).label + 0x40) = uVar15;
  *(undefined8 *)((this->Yaxis).label + 0x48) = uVar16;
  *(undefined8 *)((this->Yaxis).label + 0x50) = uVar17;
  *(undefined8 *)((this->Yaxis).label + 0x58) = uVar18;
  *(undefined8 *)((this->Yaxis).label + 0x60) = uVar19;
  (this->Yaxis).label_color.r = dVar20;
  (this->Yaxis).label_color.g = dVar21;
  (this->Yaxis).label_color.b = dVar22;
  (this->Yaxis).label_fontsize = dVar23;
  (this->Yaxis).label_fontname = iVar30;
  (this->Yaxis).numbers = bVar33;
  *(undefined3 *)&(this->Yaxis).field_0xcd = uVar32;
  (this->Yaxis).numbers_color.r = dVar24;
  (this->Yaxis).numbers_color.g = dVar25;
  (this->Yaxis).numbers_color.b = dVar26;
  (this->Yaxis).numbers_fontsize = dVar27;
  (this->Yaxis).min = dVar28;
  (this->Yaxis).max = dVar29;
  this->gridx = source->gridx;
  this->gridy = source->gridy;
  dVar1 = (source->grid_color).g;
  (this->grid_color).r = (source->grid_color).r;
  (this->grid_color).g = dVar1;
  (this->grid_color).b = (source->grid_color).b;
  this->grid_width = source->grid_width;
  sVar37 = strlen(source->title);
  if (sVar37 < 100) {
    strcpy(this->title,source->title);
  }
  (this->title_color).b = (source->title_color).b;
  dVar1 = (source->title_color).g;
  (this->title_color).r = (source->title_color).r;
  (this->title_color).g = dVar1;
  this->title_fontsize = source->title_fontsize;
  this->title_fontname = 0;
  dVar1 = source->picture_sizeY;
  this->picture_sizeX = source->picture_sizeX;
  this->picture_sizeY = dVar1;
  this->def_line_width = source->def_line_width;
  (this->def_line_color).b = (source->def_line_color).b;
  dVar1 = (source->def_line_color).g;
  (this->def_line_color).r = (source->def_line_color).r;
  (this->def_line_color).g = dVar1;
  return;
}

Assistant:

ChFile_ps_graph_setting::ChFile_ps_graph_setting(ChFile_ps_graph_setting& source) {
    Xaxis = source.Xaxis;
    Yaxis = source.Yaxis;

    gridx = source.gridx;
    gridy = source.gridy;
    grid_color = source.grid_color;
    grid_width = source.grid_width;

    SetTitle(source.title);
    title_color = source.title_color;
    title_fontsize = source.title_fontsize;
    title_fontname = 0;

    picture_sizeX = source.picture_sizeX;
    picture_sizeY = source.picture_sizeY;

    def_line_width = source.def_line_width;
    def_line_color = source.def_line_color;
}